

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::PostfixQualifiedType::printLeft
          (PostfixQualifiedType *this,OutputStream *s)

{
  OutputStream *s_local;
  PostfixQualifiedType *this_local;
  
  (*this->Ty->_vptr_Node[4])(this->Ty,s);
  OutputStream::operator+=(s,this->Postfix);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    Ty->printLeft(s);
    s += Postfix;
  }